

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Config config;
  CMakeParser parser;
  Config local_1e8;
  CMakeParser local_1b8;
  
  ParseOptions(&local_1e8,argc,argv);
  CMakeParser::CMakeParser(&local_1b8);
  CMakeParser::SetDebugMode(&local_1b8,local_1e8.debugMode);
  local_1b8.evalMode = local_1e8.evalMode;
  local_1b8.parserCtx.immediateEval = local_1e8.evalMode == Immediate;
  CMakeParser::SetInput(&local_1b8,local_1e8.inputMode,&local_1e8.input);
  iVar1 = CMakeParser::Parse(&local_1b8);
  yy::parser::~parser(&local_1b8.parser);
  std::vector<rpn::RPNExpression,_std::allocator<rpn::RPNExpression>_>::~vector
            (&local_1b8.parserCtx.rpnExprList);
  std::
  vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
             *)&local_1b8.parserCtx);
  CMakeScanner::~CMakeScanner(&local_1b8.scanner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.input._M_dataplus._M_p != &local_1e8.input.field_2) {
    operator_delete(local_1e8.input._M_dataplus._M_p,
                    local_1e8.input.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    const auto config = ParseOptions(argc, argv);
    CMakeParser parser;

    parser.SetDebugMode(config.debugMode);
    parser.SetEvaluationMode(config.evalMode);
    parser.SetInput(config.inputMode, config.input);

    return parser.Parse();
}